

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DetonationPdu.cpp
# Opt level: O2

int __thiscall DIS::DetonationPdu::getMarshalledSize(DetonationPdu *this)

{
  undefined8 *puVar1;
  pointer pVVar2;
  undefined8 uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  VariableParameter listElement;
  
  iVar4 = WarfareFamilyPdu::getMarshalledSize(&this->super_WarfareFamilyPdu);
  iVar5 = EntityID::getMarshalledSize(&this->_explodingEntityID);
  iVar6 = EventIdentifier::getMarshalledSize(&this->_eventID);
  iVar7 = Vector3Float::getMarshalledSize(&this->_velocity);
  iVar8 = Vector3Double::getMarshalledSize(&this->_locationInWorldCoordinates);
  iVar9 = MunitionDescriptor::getMarshalledSize(&this->_descriptor);
  iVar10 = Vector3Float::getMarshalledSize(&this->_locationOfEntityCoordinates);
  iVar4 = iVar9 + iVar8 + iVar7 + iVar6 + iVar5 + iVar4 + iVar10 + 4;
  lVar12 = 8;
  for (uVar11 = 0;
      pVVar2 = (this->_variableParameters).
               super__Vector_base<DIS::VariableParameter,_std::allocator<DIS::VariableParameter>_>.
               _M_impl.super__Vector_impl_data._M_start,
      uVar11 < (ulong)((long)(this->_variableParameters).
                             super__Vector_base<DIS::VariableParameter,_std::allocator<DIS::VariableParameter>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar2 >> 5);
      uVar11 = uVar11 + 1) {
    listElement._vptr_VariableParameter = (_func_int **)&PTR__VariableParameter_001c3670;
    listElement._24_7_ = SUB87((ulong)*(undefined8 *)(&pVVar2->field_0xf + lVar12) >> 8,0);
    puVar1 = (undefined8 *)((long)&pVVar2->_vptr_VariableParameter + lVar12);
    listElement._8_8_ = *puVar1;
    uVar3 = puVar1[1];
    listElement._variableParameterFields1._0_7_ = (undefined7)uVar3;
    listElement._variableParameterFields1._7_1_ = (undefined1)((ulong)uVar3 >> 0x38);
    iVar5 = VariableParameter::getMarshalledSize(&listElement);
    iVar4 = iVar4 + iVar5;
    VariableParameter::~VariableParameter(&listElement);
    lVar12 = lVar12 + 0x20;
  }
  return iVar4;
}

Assistant:

int DetonationPdu::getMarshalledSize() const
{
   int marshalSize = 0;

   marshalSize = WarfareFamilyPdu::getMarshalledSize();
   marshalSize = marshalSize + _explodingEntityID.getMarshalledSize();  // _explodingEntityID
   marshalSize = marshalSize + _eventID.getMarshalledSize();  // _eventID
   marshalSize = marshalSize + _velocity.getMarshalledSize();  // _velocity
   marshalSize = marshalSize + _locationInWorldCoordinates.getMarshalledSize();  // _locationInWorldCoordinates
   marshalSize = marshalSize + _descriptor.getMarshalledSize();  // _descriptor
   marshalSize = marshalSize + _locationOfEntityCoordinates.getMarshalledSize();  // _locationOfEntityCoordinates
   marshalSize = marshalSize + 1;  // _detonationResult
   marshalSize = marshalSize + 1;  // _numberOfVariableParameters
   marshalSize = marshalSize + 2;  // _pad

   for(unsigned long long idx=0; idx < _variableParameters.size(); idx++)
   {
        VariableParameter listElement = _variableParameters[idx];
        marshalSize = marshalSize + listElement.getMarshalledSize();
    }

    return marshalSize;
}